

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O0

Request<capnproto_test::capnp::test::TestKeywordMethods::VoidParams,_capnproto_test::capnp::test::TestKeywordMethods::VoidResults>
* __thiscall
capnproto_test::capnp::test::TestKeywordMethods::Client::voidRequest
          (Request<capnproto_test::capnp::test::TestKeywordMethods::VoidParams,_capnproto_test::capnp::test::TestKeywordMethods::VoidResults>
           *__return_storage_ptr__,Client *this,Maybe<capnp::MessageSize> *sizeHint)

{
  long lVar1;
  Maybe<capnp::MessageSize> local_38;
  Maybe<capnp::MessageSize> *local_20;
  Maybe<capnp::MessageSize> *sizeHint_local;
  Client *this_local;
  
  lVar1 = *(long *)(*(long *)this + -0x18);
  local_20 = sizeHint;
  sizeHint_local = (Maybe<capnp::MessageSize> *)this;
  this_local = (Client *)__return_storage_ptr__;
  kj::Maybe<capnp::MessageSize>::Maybe(&local_38,sizeHint);
  ::capnp::Capability::Client::
  newCall<capnproto_test::capnp::test::TestKeywordMethods::VoidParams,capnproto_test::capnp::test::TestKeywordMethods::VoidResults>
            (__return_storage_ptr__,(Client *)(this + lVar1),0x9ae342d394247cfc,2,&local_38,
             (CallHints)0x1);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_38);
  return __return_storage_ptr__;
}

Assistant:

::capnp::Request< ::capnproto_test::capnp::test::TestKeywordMethods::VoidParams,  ::capnproto_test::capnp::test::TestKeywordMethods::VoidResults>
TestKeywordMethods::Client::voidRequest(::kj::Maybe< ::capnp::MessageSize> sizeHint) {
  return newCall< ::capnproto_test::capnp::test::TestKeywordMethods::VoidParams,  ::capnproto_test::capnp::test::TestKeywordMethods::VoidResults>(
      0x9ae342d394247cfcull, 2, sizeHint, {true});
}